

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall
slang::SVInt::initSlowCase(SVInt *this,span<const_std::byte,_18446744073709551615UL> bytes)

{
  bool bVar1;
  size_t __n;
  uint64_t *puVar2;
  pointer pbVar3;
  unsigned_long *puVar4;
  SVInt *in_RDI;
  uint32_t words;
  SVInt *in_stack_ffffffffffffffc0;
  ulong local_38;
  uint32_t local_2c;
  size_type local_28;
  unsigned_long local_20 [2];
  span<const_std::byte,_18446744073709551615UL> local_10;
  
  bVar1 = isSingleWord(in_RDI);
  if (bVar1) {
    (in_RDI->super_SVIntStorage).field_0.val = 0;
    pbVar3 = std::span<const_std::byte,_18446744073709551615UL>::data(&local_10);
    local_20[0] = 8;
    local_28 = std::span<const_std::byte,_18446744073709551615UL>::size
                         ((span<const_std::byte,_18446744073709551615UL> *)0x2a1f66);
    puVar4 = std::min<unsigned_long>(local_20,&local_28);
    memcpy(in_RDI,pbVar3,*puVar4);
  }
  else {
    local_2c = getNumWords((SVInt *)0x2a1f9b);
    __n = SUB168(ZEXT416(local_2c) * ZEXT816(8),0);
    if (SUB168(ZEXT416(local_2c) * ZEXT816(8),8) != 0) {
      __n = 0xffffffffffffffff;
    }
    puVar2 = (uint64_t *)operator_new__(0x2a1fc9);
    memset(puVar2,0,__n);
    (in_RDI->super_SVIntStorage).field_0.pVal = puVar2;
    puVar2 = (in_RDI->super_SVIntStorage).field_0.pVal;
    pbVar3 = std::span<const_std::byte,_18446744073709551615UL>::data(&local_10);
    local_38 = (ulong)(local_2c << 3);
    in_stack_ffffffffffffffc0 =
         (SVInt *)std::span<const_std::byte,_18446744073709551615UL>::size
                            ((span<const_std::byte,_18446744073709551615UL> *)0x2a2019);
    puVar4 = std::min<unsigned_long>(&local_38,(unsigned_long *)&stack0xffffffffffffffc0);
    memcpy(puVar2,pbVar3,*puVar4);
  }
  clearUnusedBits(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void SVInt::initSlowCase(std::span<const byte> bytes) {
    if (isSingleWord()) {
        val = 0;
        memcpy(&val, bytes.data(), std::min<size_t>(WORD_SIZE, bytes.size()));
    }
    else {
        uint32_t words = getNumWords();
        pVal = new uint64_t[words](); // allocation is zero cleared
        memcpy(pVal, bytes.data(), std::min<size_t>(words * WORD_SIZE, bytes.size()));
    }
    clearUnusedBits();
}